

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O2

bool crnlib::file_utils::does_dir_exist(char *pDir)

{
  bool bVar1;
  int iVar2;
  stat stat_buf;
  stat local_90;
  
  iVar2 = stat(pDir,&local_90);
  if (iVar2 == 0) {
    bVar1 = (local_90.st_mode & 0xf000) == 0xa000 || (local_90.st_mode & 0xf000) == 0x4000;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool file_utils::does_dir_exist(const char* pDir) {
  struct stat stat_buf;
  int result = stat(pDir, &stat_buf);
  if (result)
    return false;
  if (S_ISDIR(stat_buf.st_mode) || S_ISLNK(stat_buf.st_mode))
    return true;
  return false;
}